

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall hdc::Program::Program(Program *this)

{
  Program *this_local;
  
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_002209e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>_>
  ::map(&this->sourceFiles);
  this->functionCounter = 0;
  this->classCounter = 0;
  ASTNode::setKind(&this->super_ASTNode,AST_PROGRAM);
  return;
}

Assistant:

Program::Program() {
    functionCounter = 0;
    classCounter = 0;
    setKind(AST_PROGRAM);
}